

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

void __thiscall btSymMatrix<int>::resize(btSymMatrix<int> *this,int n,int *init)

{
  undefined4 in_ESI;
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x20) = in_ESI;
  btAlignedObjectArray<int>::resize(&this->store,n,init);
  return;
}

Assistant:

void					resize(int n,const T& init=T())			{ dim=n;store.resize((n*(n+1))/2,init); }